

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

char * fct_clp__optval2(fct_clp_t *clp,char *option,char *default_val)

{
  fctcl_t *pfVar1;
  fctcl_t *clo;
  char *default_val_local;
  char *option_local;
  fct_clp_t *clp_local;
  
  if (clp == (fct_clp_t *)0x0) {
    __assert_fail("clp != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x6d2
                  ,"const char *fct_clp__optval2(fct_clp_t *, const char *, const char *)");
  }
  if (option == (char *)0x0) {
    __assert_fail("option != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x6d3
                  ,"const char *fct_clp__optval2(fct_clp_t *, const char *, const char *)");
  }
  pfVar1 = fct_clp__get_clo(clp,option);
  clp_local = (fct_clp_t *)default_val;
  if ((pfVar1 != (fctcl_t *)0x0) && (pfVar1->value != (char *)0x0)) {
    clp_local = (fct_clp_t *)pfVar1->value;
  }
  return (char *)clp_local;
}

Assistant:

static char const*
fct_clp__optval2(fct_clp_t *clp, char const *option, char const *default_val)
{
    fctcl_t const *clo =NULL;
    FCT_ASSERT( clp != NULL );
    FCT_ASSERT( option != NULL );
    clo = fct_clp__get_clo(clp, option);
    if ( clo == NULL || clo->value == NULL)
    {
        return default_val;
    }
    return clo->value;
}